

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

void realize_virt_arrays(j_common_ptr cinfo)

{
  uint uVar1;
  uint uVar2;
  jpeg_memory_mgr *pjVar3;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var4;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var5;
  ulong uVar6;
  size_t sVar7;
  JSAMPARRAY ppJVar8;
  JBLOCKARRAY ppaJVar9;
  JDIMENSION JVar10;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **pp_Var11;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **pp_Var12;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **pp_Var13;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **pp_Var14;
  size_t min_bytes_needed;
  ulong max_bytes_needed;
  bool bVar15;
  
  pjVar3 = cinfo->mem;
  max_bytes_needed = 0;
  min_bytes_needed = 0;
  pp_Var11 = &pjVar3[1].request_virt_sarray;
  pp_Var13 = pp_Var11;
  while (p_Var4 = *pp_Var13,
        p_Var4 != (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   *)0x0) {
    if (*(long *)p_Var4 == 0) {
      uVar1 = *(uint *)(p_Var4 + 0xc);
      uVar6 = (ulong)*(uint *)(p_Var4 + 8) * (ulong)uVar1;
      uVar2 = *(uint *)(p_Var4 + 0x10);
      bVar15 = CARRY8(max_bytes_needed,uVar6);
      max_bytes_needed = max_bytes_needed + uVar6;
      if (bVar15) {
        *(undefined8 *)&cinfo->err->msg_code = 0xa00000036;
        (*cinfo->err->error_exit)(cinfo);
      }
      min_bytes_needed = min_bytes_needed + (ulong)uVar2 * (ulong)uVar1;
    }
    pp_Var13 = (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **)
               (p_Var4 + 0x30);
  }
  pp_Var12 = &pjVar3[1].request_virt_barray;
  pp_Var14 = pp_Var12;
  while (p_Var5 = *pp_Var14,
        p_Var5 != (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   *)0x0) {
    if (*(long *)p_Var5 == 0) {
      uVar1 = *(uint *)(p_Var5 + 0xc);
      uVar6 = (ulong)*(uint *)(p_Var5 + 8) * (ulong)uVar1 * 0x80;
      uVar2 = *(uint *)(p_Var5 + 0x10);
      bVar15 = CARRY8(max_bytes_needed,uVar6);
      max_bytes_needed = max_bytes_needed + uVar6;
      if (bVar15) {
        *(undefined8 *)&cinfo->err->msg_code = 0xb00000036;
        (*cinfo->err->error_exit)(cinfo);
      }
      min_bytes_needed = min_bytes_needed + (ulong)uVar1 * (ulong)uVar2 * 0x80;
    }
    pp_Var14 = (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **)
               (p_Var5 + 0x30);
  }
  if (min_bytes_needed != 0) {
    sVar7 = jpeg_mem_available(cinfo,min_bytes_needed,max_bytes_needed,
                               (size_t)pjVar3[1].realize_virt_arrays);
    uVar6 = 1000000000;
    if (sVar7 < max_bytes_needed) {
      uVar6 = 1;
      if (min_bytes_needed <= sVar7) {
        uVar6 = sVar7 / min_bytes_needed;
      }
    }
    while( true ) {
      p_Var4 = *pp_Var11;
      if (p_Var4 == (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                     *)0x0) break;
      if (*(long *)p_Var4 == 0) {
        JVar10 = *(JDIMENSION *)(p_Var4 + 8);
        if (uVar6 < (long)((ulong)JVar10 - 1) / (long)(ulong)*(uint *)(p_Var4 + 0x10) + 1U) {
          *(uint *)(p_Var4 + 0x14) = *(uint *)(p_Var4 + 0x10) * (int)uVar6;
          jpeg_open_backing_store
                    (cinfo,(backing_store_ptr)(p_Var4 + 0x38),
                     (ulong)*(uint *)(p_Var4 + 0xc) * (ulong)JVar10);
          *(undefined4 *)(p_Var4 + 0x2c) = 1;
          JVar10 = *(JDIMENSION *)(p_Var4 + 0x14);
        }
        else {
          *(JDIMENSION *)(p_Var4 + 0x14) = JVar10;
        }
        ppJVar8 = alloc_sarray(cinfo,1,*(JDIMENSION *)(p_Var4 + 0xc),JVar10);
        *(JSAMPARRAY *)p_Var4 = ppJVar8;
        *(undefined4 *)(p_Var4 + 0x18) = *(undefined4 *)&pjVar3[1].access_virt_sarray;
        *(undefined8 *)(p_Var4 + 0x1c) = 0;
        *(undefined4 *)(p_Var4 + 0x28) = 0;
      }
      pp_Var11 = (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                  **)(p_Var4 + 0x30);
    }
    while (p_Var5 = *pp_Var12,
          p_Var5 != (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                     *)0x0) {
      if (*(long *)p_Var5 == 0) {
        JVar10 = *(JDIMENSION *)(p_Var5 + 8);
        if (uVar6 < (long)((ulong)JVar10 - 1) / (long)(ulong)*(uint *)(p_Var5 + 0x10) + 1U) {
          *(uint *)(p_Var5 + 0x14) = *(uint *)(p_Var5 + 0x10) * (int)uVar6;
          jpeg_open_backing_store
                    (cinfo,(backing_store_ptr)(p_Var5 + 0x38),
                     (ulong)*(uint *)(p_Var5 + 0xc) * (ulong)JVar10 * 0x80);
          *(undefined4 *)(p_Var5 + 0x2c) = 1;
          JVar10 = *(JDIMENSION *)(p_Var5 + 0x14);
        }
        else {
          *(JDIMENSION *)(p_Var5 + 0x14) = JVar10;
        }
        ppaJVar9 = alloc_barray(cinfo,1,*(JDIMENSION *)(p_Var5 + 0xc),JVar10);
        *(JBLOCKARRAY *)p_Var5 = ppaJVar9;
        *(undefined4 *)(p_Var5 + 0x18) = *(undefined4 *)&pjVar3[1].access_virt_sarray;
        *(undefined8 *)(p_Var5 + 0x1c) = 0;
        *(undefined4 *)(p_Var5 + 0x28) = 0;
      }
      pp_Var12 = (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                  **)(p_Var5 + 0x30);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
realize_virt_arrays(j_common_ptr cinfo)
/* Allocate the in-memory buffers for any unrealized virtual arrays */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  size_t space_per_minheight, maximum_space, avail_mem;
  size_t minheights, max_minheights;
  jvirt_sarray_ptr sptr;
  jvirt_barray_ptr bptr;

  /* Compute the minimum space needed (maxaccess rows in each buffer)
   * and the maximum space needed (full image height in each buffer).
   * These may be of use to the system-dependent jpeg_mem_available routine.
   */
  space_per_minheight = 0;
  maximum_space = 0;
  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      size_t new_space = (long)sptr->rows_in_array *
                         (long)sptr->samplesperrow * sizeof(JSAMPLE);

      space_per_minheight += (long)sptr->maxaccess *
                             (long)sptr->samplesperrow * sizeof(JSAMPLE);
      if (SIZE_MAX - maximum_space < new_space)
        out_of_memory(cinfo, 10);
      maximum_space += new_space;
    }
  }
  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      size_t new_space = (long)bptr->rows_in_array *
                         (long)bptr->blocksperrow * sizeof(JBLOCK);

      space_per_minheight += (long)bptr->maxaccess *
                             (long)bptr->blocksperrow * sizeof(JBLOCK);
      if (SIZE_MAX - maximum_space < new_space)
        out_of_memory(cinfo, 11);
      maximum_space += new_space;
    }
  }

  if (space_per_minheight <= 0)
    return;                     /* no unrealized arrays, no work */

  /* Determine amount of memory to actually use; this is system-dependent. */
  avail_mem = jpeg_mem_available(cinfo, space_per_minheight, maximum_space,
                                 mem->total_space_allocated);

  /* If the maximum space needed is available, make all the buffers full
   * height; otherwise parcel it out with the same number of minheights
   * in each buffer.
   */
  if (avail_mem >= maximum_space)
    max_minheights = 1000000000L;
  else {
    max_minheights = avail_mem / space_per_minheight;
    /* If there doesn't seem to be enough space, try to get the minimum
     * anyway.  This allows a "stub" implementation of jpeg_mem_available().
     */
    if (max_minheights <= 0)
      max_minheights = 1;
  }

  /* Allocate the in-memory buffers and initialize backing store as needed. */

  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long)sptr->rows_in_array - 1L) / sptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
        /* This buffer fits in memory */
        sptr->rows_in_mem = sptr->rows_in_array;
      } else {
        /* It doesn't fit in memory, create backing store. */
        sptr->rows_in_mem = (JDIMENSION)(max_minheights * sptr->maxaccess);
        jpeg_open_backing_store(cinfo, &sptr->b_s_info,
                                (long)sptr->rows_in_array *
                                (long)sptr->samplesperrow *
                                (long)sizeof(JSAMPLE));
        sptr->b_s_open = TRUE;
      }
      sptr->mem_buffer = alloc_sarray(cinfo, JPOOL_IMAGE,
                                      sptr->samplesperrow, sptr->rows_in_mem);
      sptr->rowsperchunk = mem->last_rowsperchunk;
      sptr->cur_start_row = 0;
      sptr->first_undef_row = 0;
      sptr->dirty = FALSE;
    }
  }

  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long)bptr->rows_in_array - 1L) / bptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
        /* This buffer fits in memory */
        bptr->rows_in_mem = bptr->rows_in_array;
      } else {
        /* It doesn't fit in memory, create backing store. */
        bptr->rows_in_mem = (JDIMENSION)(max_minheights * bptr->maxaccess);
        jpeg_open_backing_store(cinfo, &bptr->b_s_info,
                                (long)bptr->rows_in_array *
                                (long)bptr->blocksperrow *
                                (long)sizeof(JBLOCK));
        bptr->b_s_open = TRUE;
      }
      bptr->mem_buffer = alloc_barray(cinfo, JPOOL_IMAGE,
                                      bptr->blocksperrow, bptr->rows_in_mem);
      bptr->rowsperchunk = mem->last_rowsperchunk;
      bptr->cur_start_row = 0;
      bptr->first_undef_row = 0;
      bptr->dirty = FALSE;
    }
  }
}